

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

uint16_t reverse_bits(uint v)

{
  uint s;
  uint r;
  uint v_local;
  
  s = 0xf;
  r = v;
  for (v_local = v >> 1; v_local != 0; v_local = v_local >> 1) {
    r = v_local & 1 | r << 1;
    s = s - 1;
  }
  return (uint16_t)(r << ((byte)s & 0x1f));
}

Assistant:

static uint16_t reverse_bits(uint v)
{
	uint r = v; // r will be reversed bits of v; first get LSB of v
	uint s = 16 - 1; // extra shift needed at end

	for (v >>= 1; v; v >>= 1) {
		r <<= 1;
		r |= v & 1;
		s--;
	}

	return r <<= s; // shift when v's highest bits are zero
}